

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

void Abc_ObjAddFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  Mem_Step_t *pMVar3;
  int *pEntry;
  char *pEntry_00;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  long *plVar9;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x57,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  plVar9 = (long *)((ulong)pFanin & 0xfffffffffffffffe);
  if (pObj->pNtk != (Abc_Ntk_t *)*plVar9) {
    __assert_fail("pObj->pNtk == pFaninR->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x58,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((pObj->Id < 0) || (lVar7 = plVar9[2], (int)lVar7 < 0)) {
    __assert_fail("pObj->Id >= 0 && pFaninR->Id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x59,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  uVar8 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar8 != 2) && ((*(uint *)((long)plVar9 + 0x14) & 0xf) != 3)) {
    if ((0xfffffffd < uVar8 - 5) && ((pObj->vFanins).nSize != 0)) {
      __assert_fail("!Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x5b,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if ((uVar8 == 6) && ((pObj->vFanins).nSize != 0)) {
      __assert_fail("!Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x5c,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
    }
    iVar1 = (pObj->vFanins).nSize;
    if (iVar1 == (pObj->vFanins).nCap) {
      pMVar3 = pObj->pNtk->pMmStep;
      if (iVar1 == 0) {
        (pObj->vFanins).nCap = 1;
      }
      iVar1 = (pObj->vFanins).nCap;
      if (pMVar3 == (Mem_Step_t *)0x0) {
        piVar4 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar4 = (int *)Mem_StepEntryFetch(pMVar3,iVar1 << 3);
      }
      pEntry = (pObj->vFanins).pArray;
      if (pEntry != (int *)0x0) {
        if (0 < (pObj->vFanins).nSize) {
          lVar5 = 0;
          do {
            piVar4[lVar5] = pEntry[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pObj->vFanins).nSize);
        }
        if (pMVar3 == (Mem_Step_t *)0x0) {
          free(pEntry);
          (pObj->vFanins).pArray = (int *)0x0;
        }
        else {
          Mem_StepEntryRecycle(pMVar3,(char *)pEntry,(pObj->vFanins).nCap << 2);
        }
      }
      (pObj->vFanins).nCap = (pObj->vFanins).nCap << 1;
      (pObj->vFanins).pArray = piVar4;
    }
    iVar1 = (pObj->vFanins).nSize;
    (pObj->vFanins).nSize = iVar1 + 1;
    (pObj->vFanins).pArray[iVar1] = (int)lVar7;
    iVar1 = pObj->Id;
    if (*(int *)((long)plVar9 + 0x2c) == (int)plVar9[5]) {
      pMVar3 = pObj->pNtk->pMmStep;
      if (*(int *)((long)plVar9 + 0x2c) == 0) {
        *(undefined4 *)(plVar9 + 5) = 1;
      }
      if (pMVar3 == (Mem_Step_t *)0x0) {
        pcVar6 = (char *)malloc((long)(int)plVar9[5] << 3);
      }
      else {
        pcVar6 = Mem_StepEntryFetch(pMVar3,(int)plVar9[5] << 3);
      }
      pEntry_00 = (char *)plVar9[6];
      if (pEntry_00 != (char *)0x0) {
        if (0 < *(int *)((long)plVar9 + 0x2c)) {
          lVar7 = 0;
          do {
            *(undefined4 *)(pcVar6 + lVar7 * 4) = *(undefined4 *)(pEntry_00 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar9 + 0x2c));
        }
        if (pMVar3 == (Mem_Step_t *)0x0) {
          free(pEntry_00);
          plVar9[6] = 0;
        }
        else {
          Mem_StepEntryRecycle(pMVar3,pEntry_00,(int)plVar9[5] << 2);
        }
      }
      *(int *)(plVar9 + 5) = (int)plVar9[5] << 1;
      plVar9[6] = (long)pcVar6;
    }
    iVar2 = *(int *)((long)plVar9 + 0x2c);
    *(int *)((long)plVar9 + 0x2c) = iVar2 + 1;
    *(int *)(plVar9[6] + (long)iVar2 * 4) = iVar1;
    if (((ulong)pFanin & 1) != 0) {
      iVar1 = (pObj->vFanins).nSize;
      if (1 < iVar1 - 1U) {
        __assert_fail("i >=0 && i < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x17e,"void Abc_ObjSetFaninC(Abc_Obj_t *, int)");
      }
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | (uint)(iVar1 != 1) * 0x400 + 0x400;
    }
    return;
  }
  __assert_fail("!Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x5a,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjAddFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFaninR = Abc_ObjRegular(pFanin);
    assert( !Abc_ObjIsComplement(pObj) );
    assert( pObj->pNtk == pFaninR->pNtk );
    assert( pObj->Id >= 0 && pFaninR->Id >= 0 );
    assert( !Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR) );    // fanin of PI or fanout of PO
    assert( !Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj) );  // CO with two fanins
    assert( !Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj) ); // net with two fanins
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pObj->vFanins,     pFaninR->Id );
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninR->vFanouts, pObj->Id    );
    if ( Abc_ObjIsComplement(pFanin) )
        Abc_ObjSetFaninC( pObj, Abc_ObjFaninNum(pObj)-1 );
}